

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VConstrMask(N_Vector C,N_Vector X,N_Vector M,sunindextype param_4,int myid)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  sunrealtype sVar8;
  
  if (param_4 < 7) {
    printf("Error Test_N_VConstrMask: Local vector length is %ld, length must be >= 7\n",param_4);
    iVar2 = 1;
  }
  else {
    uVar4 = 0;
    while( true ) {
      if (param_4 == uVar4) break;
      set_element(M,uVar4,-1.0);
      sVar8 = (sunrealtype)(&DAT_00110df8)[uVar4 % 7];
      set_element(C,uVar4,(sunrealtype)(&DAT_00110dc0)[uVar4 % 7]);
      set_element(X,uVar4,sVar8);
      uVar4 = uVar4 + 1;
    }
    dVar6 = get_time();
    iVar2 = N_VConstrMask(C,X,M);
    sync_device(X);
    dVar7 = get_time();
    iVar3 = check_ans(0.0,M,param_4);
    if ((iVar3 == 0) && (iVar2 != 0)) {
      iVar2 = 0;
      if (myid == 0) {
        puts("PASSED test -- N_VConstrMask Case 1 ");
      }
    }
    else {
      iVar2 = 1;
      printf(">>> FAILED test -- N_VConstrMask Case 1, Proc %d \n",(ulong)(uint)myid);
    }
    max_time(X,dVar7 - dVar6);
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n","N_VConstrMask");
    }
    uVar4 = 0;
    while( true ) {
      if (param_4 == uVar4) break;
      set_element(M,uVar4,-1.0);
      sVar8 = (sunrealtype)(&DAT_00110e58)[uVar4 % 5];
      set_element(C,uVar4,(sunrealtype)(&DAT_00110e30)[uVar4 % 5]);
      set_element(X,uVar4,sVar8);
      uVar4 = uVar4 + 1;
    }
    dVar6 = get_time();
    iVar3 = N_VConstrMask(C,X,M);
    sync_device(X);
    bVar1 = false;
    dVar7 = get_time();
    uVar4 = 0;
    while( true ) {
      if (param_4 == uVar4) break;
      sVar8 = get_element(M,uVar4);
      if ((uVar4 / 5) * 5 + 2 == uVar4) {
        bVar5 = sVar8 == 0.0;
      }
      else {
        bVar5 = sVar8 == 1.0;
      }
      if ((!bVar5) || (NAN(sVar8))) {
        bVar1 = true;
      }
      uVar4 = uVar4 + 1;
    }
    if (bVar1 || iVar3 != 0) {
      printf(">>> FAILED test -- N_VConstrMask Case 2, Proc %d \n",(ulong)(uint)myid,uVar4 % 5);
      iVar2 = iVar2 + 1;
    }
    else if (myid == 0) {
      puts("PASSED test -- N_VConstrMask Case 2 ");
    }
    max_time(X,dVar7 - dVar6);
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n","N_VConstrMask");
    }
  }
  return iVar2;
}

Assistant:

int Test_N_VConstrMask(N_Vector C, N_Vector X, N_Vector M,
                       sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunindextype i;
  sunbooleantype test;

  if (local_length < 7)
  {
    printf("Error Test_N_VConstrMask: Local vector length is %ld, length must "
           "be >= 7\n",
           (long int)local_length);
    return (1);
  }

  /*
   * Case 1: Return True
   */

  /* fill vector data */
  for (i = 0; i < local_length; i++)
  {
    set_element(M, i, NEG_ONE);

    switch (i % 7)
    {
    case 0:
      /* c = -2, test for < 0*/
      set_element(C, i, NEG_TWO);
      set_element(X, i, NEG_TWO);
      break;

    case 1:
      /* c = -1, test for <= 0 */
      set_element(C, i, NEG_ONE);
      set_element(X, i, NEG_ONE);
      break;

    case 2:
      /* c = -1, test for == 0 */
      set_element(C, i, NEG_ONE);
      set_element(X, i, ZERO);
      break;

    case 3:
      /* c = 0, no test */
      set_element(C, i, ZERO);
      set_element(X, i, HALF);
      break;

    case 4:
      /* c = 1, test for == 0*/
      set_element(C, i, ONE);
      set_element(X, i, ZERO);
      break;

    case 5:
      /* c = 1, test for >= 0*/
      set_element(C, i, ONE);
      set_element(X, i, ONE);
      break;

    case 6:
      /* c = 2, test for > 0 */
      set_element(C, i, TWO);
      set_element(X, i, TWO);
      break;
    }
  }

  start_time = get_time();
  test       = N_VConstrMask(C, X, M);
  sync_device(X);
  stop_time = get_time();

  /* M should be vector of 0 */
  failure = check_ans(ZERO, M, local_length);

  if (failure || !test)
  {
    printf(">>> FAILED test -- N_VConstrMask Case 1, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VConstrMask Case 1 \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VConstrMask", maxt);

  /*
   * Case 2: Return False
   */

  /* reset failure */
  failure = 0;

  /* fill vector data */
  for (i = 0; i < local_length; i++)
  {
    set_element(M, i, NEG_ONE);

    switch (i % 5)
    {
    case 0:
      /* c = -2, test for < 0*/
      set_element(C, i, NEG_TWO);
      set_element(X, i, TWO);
      break;

    case 1:
      /* c = -1, test for <= 0 */
      set_element(C, i, NEG_ONE);
      set_element(X, i, ONE);
      break;

    case 2:
      /* c = 0, no test */
      set_element(C, i, ZERO);
      set_element(X, i, HALF);
      break;

    case 3:
      /* c = 1, test for >= 0*/
      set_element(C, i, ONE);
      set_element(X, i, NEG_ONE);
      break;

    case 4:
      /* c = 2, test for > 0 */
      set_element(C, i, TWO);
      set_element(X, i, NEG_TWO);
      break;
    }
  }

  start_time = get_time();
  test       = N_VConstrMask(C, X, M);
  sync_device(X);
  stop_time = get_time();

  /* check mask vector */
  for (i = 0; i < local_length; i++)
  {
    if ((i % 5) == 2)
    {
      if (get_element(M, i) != ZERO) { failure = 1; }
    }
    else
    {
      if (get_element(M, i) != ONE) { failure = 1; }
    }
  }

  if (failure || test)
  {
    printf(">>> FAILED test -- N_VConstrMask Case 2, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VConstrMask Case 2 \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VConstrMask", maxt);

  return (fails);
}